

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O2

int SSL_SESSION_set1_id(SSL_SESSION *session,uint8_t *sid,size_t sid_len)

{
  bool bVar1;
  Span<const_unsigned_char> in;
  
  in.size_ = sid_len;
  in.data_ = sid;
  bVar1 = bssl::InplaceVector<unsigned_char,_32UL>::TryCopyFrom(&session->session_id,in);
  if (!bVar1) {
    ERR_put_error(0x10,0,0x122,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                  ,0x357);
  }
  return (uint)bVar1;
}

Assistant:

int SSL_SESSION_set1_id(SSL_SESSION *session, const uint8_t *sid,
                        size_t sid_len) {
  if (!session->session_id.TryCopyFrom(Span(sid, sid_len))) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_SSL_SESSION_ID_TOO_LONG);
    return 0;
  }

  return 1;
}